

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

void free_codes(archive_read *a)

{
  free(a->bidders[0].data);
  free(a->bidders[0].options);
  free(a->bidders[1].bid);
  free(a->bidders[2].data);
  free(a->bidders[0].init);
  free(a->bidders[1].name);
  free(a->bidders[1].free);
  free(a->bidders[2].init);
  a->bidders[2].bid = (_func_int_archive_read_filter_bidder_ptr_archive_read_filter_ptr *)0x0;
  a->bidders[2].init = (_func_int_archive_read_filter_ptr *)0x0;
  a->bidders[2].data = (void *)0x0;
  a->bidders[2].name = (char *)0x0;
  a->bidders[1].options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
  a->bidders[1].free = (_func_int_archive_read_filter_bidder_ptr *)0x0;
  a->bidders[1].bid = (_func_int_archive_read_filter_bidder_ptr_archive_read_filter_ptr *)0x0;
  a->bidders[1].init = (_func_int_archive_read_filter_ptr *)0x0;
  a->bidders[1].data = (void *)0x0;
  a->bidders[1].name = (char *)0x0;
  a->bidders[0].options = (_func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr *)0x0;
  a->bidders[0].free = (_func_int_archive_read_filter_bidder_ptr *)0x0;
  a->bidders[0].bid = (_func_int_archive_read_filter_bidder_ptr_archive_read_filter_ptr *)0x0;
  a->bidders[0].init = (_func_int_archive_read_filter_ptr *)0x0;
  a->bidders[0].data = (void *)0x0;
  a->bidders[0].name = (char *)0x0;
  return;
}

Assistant:

static void
free_codes(struct archive_read *a)
{
  struct rar *rar = (struct rar *)(a->format->data);
  free(rar->maincode.tree);
  free(rar->offsetcode.tree);
  free(rar->lowoffsetcode.tree);
  free(rar->lengthcode.tree);
  free(rar->maincode.table);
  free(rar->offsetcode.table);
  free(rar->lowoffsetcode.table);
  free(rar->lengthcode.table);
  memset(&rar->maincode, 0, sizeof(rar->maincode));
  memset(&rar->offsetcode, 0, sizeof(rar->offsetcode));
  memset(&rar->lowoffsetcode, 0, sizeof(rar->lowoffsetcode));
  memset(&rar->lengthcode, 0, sizeof(rar->lengthcode));
}